

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Cube::setupBackFace(Cube *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar1 = this->x;
  fVar2 = this->y;
  fVar3 = this->z;
  fVar4 = this->l + fVar1;
  fVar5 = this->h + fVar2;
  this->positionData[0x12] = fVar1;
  this->positionData[0x13] = fVar2;
  this->positionData[0x14] = fVar3;
  this->positionData[0x15] = fVar4;
  this->positionData[0x16] = fVar2;
  this->positionData[0x17] = fVar3;
  this->positionData[0x18] = fVar4;
  this->positionData[0x19] = fVar5;
  this->positionData[0x1a] = fVar3;
  this->positionData[0x1b] = fVar1;
  this->positionData[0x1c] = fVar2;
  this->positionData[0x1d] = fVar3;
  this->positionData[0x1e] = fVar4;
  this->positionData[0x1f] = fVar5;
  this->positionData[0x20] = fVar3;
  this->positionData[0x21] = fVar1;
  this->positionData[0x22] = fVar5;
  this->positionData[0x23] = fVar3;
  return;
}

Assistant:

void setupBackFace() {
        float backFace[]={
            x,y,z,
            x+l,y,z,
            x+l,y+h,z,
            x,y,z,


            x+l,y+h,z,
            x,y+h,z
        };
        arrayCopy(backFace,positionData,18);
    }